

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseRequirement(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    uVar4 = (state->parse_state).mangled_idx;
    uVar5 = (state->parse_state).out_cur_idx;
    uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar7 = ParseOneCharToken(state,'X');
    if (bVar7) {
      bVar7 = ParseExpression(state);
      if (bVar7) {
        ParseOneCharToken(state,'N');
        bVar7 = ParseOneCharToken(state,'R');
        bVar8 = true;
        if (!bVar7) goto LAB_0027654a;
        bVar7 = ParseName(state);
        if (bVar7) goto LAB_0027654a;
      }
    }
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseOneCharToken(state,'T');
    if (bVar7) {
      bVar7 = ParseType(state);
      bVar8 = true;
      if (bVar7) goto LAB_0027654a;
    }
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseOneCharToken(state,'Q');
    if (bVar7) {
      bVar7 = ParseExpression(state);
      bVar8 = true;
      if (bVar7) goto LAB_0027654a;
    }
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  }
  bVar8 = false;
LAB_0027654a:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar8;
}

Assistant:

static bool ParseRequirement(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;

  if (ParseOneCharToken(state, 'X') && ParseExpression(state) &&
      Optional(ParseOneCharToken(state, 'N')) &&
      // This logic backtracks cleanly if we eat an R but a valid type doesn't
      // follow it.
      (!ParseOneCharToken(state, 'R') || ParseTypeConstraint(state))) {
    return true;
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'T') && ParseType(state)) return true;
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'Q') && ParseExpression(state)) return true;
  state->parse_state = copy;

  return false;
}